

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::
SmallVectorBase<std::variant<slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>>
::
emplaceRealloc<std::variant<slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>>
          (SmallVectorBase<std::variant<slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>>
           *this,pointer pos,
          variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
          *args)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 *puVar9;
  pointer pvVar10;
  variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
  *__cur;
  undefined8 *puVar11;
  EVP_PKEY_CTX *ctx;
  long lVar12;
  ulong capacity;
  
  if (*(long *)(this + 8) == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = *(long *)(this + 8) + 1;
  uVar1 = *(ulong *)(this + 0x10);
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  lVar12 = (long)pos - *(long *)this;
  ctx = (EVP_PKEY_CTX *)0x30;
  puVar9 = (undefined8 *)detail::allocArray(capacity,0x30);
  uVar4 = *(undefined8 *)
           &(args->
            super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
            ).
            super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
            .
            super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
            .
            super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
            .
            super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
            .
            super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
            ._M_u;
  uVar5 = *(undefined8 *)
           ((long)&(args->
                   super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                   ).
                   super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                   .
                   super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                   .
                   super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                   .
                   super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                   .
                   super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                   ._M_u + 8);
  uVar6 = *(undefined8 *)
           ((long)&(args->
                   super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                   ).
                   super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                   .
                   super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                   .
                   super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                   .
                   super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                   .
                   super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                   ._M_u + 0x10);
  uVar7 = *(undefined8 *)
           ((long)&(args->
                   super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                   ).
                   super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                   .
                   super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                   .
                   super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                   .
                   super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                   .
                   super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                   ._M_u + 0x18);
  uVar8 = *(undefined8 *)
           &(args->
            super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
            ).
            super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
            .
            super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
            .
            super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
            .
            super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
            .
            super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
            ._M_index;
  puVar11 = (undefined8 *)((long)puVar9 + lVar12 + 0x20);
  *puVar11 = *(undefined8 *)
              ((long)&(args->
                      super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                      ).
                      super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                      .
                      super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                      .
                      super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                      .
                      super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                      .
                      super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                      ._M_u + 0x20);
  puVar11[1] = uVar8;
  puVar11 = (undefined8 *)((long)puVar9 + lVar12 + 0x10);
  *puVar11 = uVar6;
  puVar11[1] = uVar7;
  *(undefined8 *)((long)puVar9 + lVar12) = uVar4;
  ((undefined8 *)((long)puVar9 + lVar12))[1] = uVar5;
  pvVar10 = *(pointer *)this;
  puVar11 = puVar9;
  if (pvVar10 + *(long *)(this + 8) == pos) {
    for (; pvVar10 != pos; pvVar10 = pvVar10 + 1) {
      uVar4 = *(undefined8 *)
               &(pvVar10->
                super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                ).
                super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                .
                super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                .
                super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                .
                super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                .
                super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                ._M_u;
      uVar5 = *(undefined8 *)
               ((long)&(pvVar10->
                       super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       ).
                       super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       ._M_u + 8);
      uVar6 = *(undefined8 *)
               ((long)&(pvVar10->
                       super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       ).
                       super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       ._M_u + 0x10);
      uVar7 = *(undefined8 *)
               ((long)&(pvVar10->
                       super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       ).
                       super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       ._M_u + 0x18);
      uVar8 = *(undefined8 *)
               &(pvVar10->
                super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                ).
                super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                .
                super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                .
                super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                .
                super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                .
                super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                ._M_index;
      puVar11[4] = *(undefined8 *)
                    ((long)&(pvVar10->
                            super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                            ).
                            super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                            .
                            super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                            .
                            super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                            .
                            super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                            .
                            super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                            ._M_u + 0x20);
      puVar11[5] = uVar8;
      puVar11[2] = uVar6;
      puVar11[3] = uVar7;
      *puVar11 = uVar4;
      puVar11[1] = uVar5;
      puVar11 = puVar11 + 6;
    }
  }
  else {
    for (; pvVar10 != pos; pvVar10 = pvVar10 + 1) {
      uVar4 = *(undefined8 *)
               &(pvVar10->
                super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                ).
                super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                .
                super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                .
                super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                .
                super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                .
                super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                ._M_u;
      uVar5 = *(undefined8 *)
               ((long)&(pvVar10->
                       super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       ).
                       super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       ._M_u + 8);
      uVar6 = *(undefined8 *)
               ((long)&(pvVar10->
                       super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       ).
                       super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       ._M_u + 0x10);
      uVar7 = *(undefined8 *)
               ((long)&(pvVar10->
                       super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       ).
                       super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       ._M_u + 0x18);
      uVar8 = *(undefined8 *)
               &(pvVar10->
                super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                ).
                super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                .
                super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                .
                super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                .
                super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                .
                super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                ._M_index;
      puVar11[4] = *(undefined8 *)
                    ((long)&(pvVar10->
                            super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                            ).
                            super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                            .
                            super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                            .
                            super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                            .
                            super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                            .
                            super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                            ._M_u + 0x20);
      puVar11[5] = uVar8;
      puVar11[2] = uVar6;
      puVar11[3] = uVar7;
      *puVar11 = uVar4;
      puVar11[1] = uVar5;
      puVar11 = puVar11 + 6;
    }
    lVar2 = *(long *)(this + 8);
    lVar3 = *(long *)this;
    puVar11 = (undefined8 *)((long)puVar9 + lVar12);
    for (; pos != (pointer)(lVar2 * 0x30 + lVar3); pos = pos + 1) {
      uVar4 = *(undefined8 *)
               &(pos->
                super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                ).
                super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                .
                super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                .
                super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                .
                super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                .
                super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                ._M_u;
      uVar5 = *(undefined8 *)
               ((long)&(pos->
                       super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       ).
                       super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       ._M_u + 8);
      uVar6 = *(undefined8 *)
               ((long)&(pos->
                       super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       ).
                       super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       ._M_u + 0x10);
      uVar7 = *(undefined8 *)
               ((long)&(pos->
                       super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       ).
                       super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       ._M_u + 0x18);
      uVar8 = *(undefined8 *)
               &(pos->
                super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                ).
                super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                .
                super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                .
                super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                .
                super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                .
                super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                ._M_index;
      puVar11[10] = *(undefined8 *)
                     ((long)&(pos->
                             super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                             ).
                             super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                             .
                             super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                             .
                             super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                             .
                             super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                             .
                             super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                             ._M_u + 0x20);
      puVar11[0xb] = uVar8;
      puVar11[8] = uVar6;
      puVar11[9] = uVar7;
      puVar11[6] = uVar4;
      puVar11[7] = uVar5;
      puVar11 = puVar11 + 6;
    }
  }
  SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  ::cleanup((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
             *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = capacity;
  *(undefined8 **)this = puVar9;
  return (pointer)((long)puVar9 + lVar12);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}